

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O1

void __thiscall
solitaire::Solitaire::throwExceptionOnInvalidTableauPileId(Solitaire *this,PileId *id)

{
  runtime_error *this_00;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (id->t < 7) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,id->t);
  std::operator+(&local_38,"Cannot access tableau pile with id: ",&sStack_58);
  std::runtime_error::runtime_error(this_00,(string *)&local_38);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Solitaire::throwExceptionOnInvalidTableauPileId(const PileId id) const {
    if (id.t >= tableauPilesCount)
        throw std::runtime_error {
            "Cannot access tableau pile with id: " + std::to_string(id)
        };
}